

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

void ON_NurbsSurface::ON_Internal_ConvertToCurve(ON_NurbsSurface *srf,int dir,ON_NurbsCurve *crv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  double *Scv;
  double *Ncv;
  int j;
  int i;
  int knot_count;
  int Ndim;
  int n;
  int Sdim;
  ON_NurbsCurve *crv_local;
  int dir_local;
  ON_NurbsSurface *srf_local;
  
  ON_Curve::DestroyCurveTree(&crv->super_ON_Curve);
  crv_local._4_4_ = dir;
  if (dir != 0) {
    crv_local._4_4_ = 1;
  }
  iVar1 = CVSize(srf);
  iVar2 = CVCount(srf,1 - crv_local._4_4_);
  iVar3 = KnotCount(srf,crv_local._4_4_);
  crv->m_dim = iVar1 * iVar2;
  crv->m_is_rat = 0;
  iVar4 = Order(srf,crv_local._4_4_);
  crv->m_order = iVar4;
  iVar4 = CVCount(srf,crv_local._4_4_);
  crv->m_cv_count = iVar4;
  crv->m_cv_stride = crv->m_dim;
  iVar4 = CVCount(srf,crv_local._4_4_);
  ON_NurbsCurve::ReserveCVCapacity(crv,iVar4 * iVar1 * iVar2);
  iVar4 = KnotCount(srf,crv_local._4_4_);
  ON_NurbsCurve::ReserveKnotCapacity(crv,iVar4);
  if ((crv->m_knot != srf->m_knot[crv_local._4_4_]) &&
     (srf->m_knot[crv_local._4_4_] != (double *)0x0)) {
    memcpy(crv->m_knot,srf->m_knot[crv_local._4_4_],(long)iVar3 << 3);
  }
  if ((crv->m_cv != srf->m_cv) && (srf->m_cv != (double *)0x0)) {
    if (crv_local._4_4_ == 0) {
      for (Ncv._4_4_ = 0; Ncv._4_4_ < crv->m_cv_count; Ncv._4_4_ = Ncv._4_4_ + 1) {
        Scv = ON_NurbsCurve::CV(crv,Ncv._4_4_);
        for (Ncv._0_4_ = 0; (int)Ncv < iVar2; Ncv._0_4_ = (int)Ncv + 1) {
          pdVar5 = CV(srf,Ncv._4_4_,(int)Ncv);
          memcpy(Scv,pdVar5,(long)iVar1 << 3);
          Scv = Scv + iVar1;
        }
      }
    }
    else {
      for (Ncv._4_4_ = 0; Ncv._4_4_ < crv->m_cv_count; Ncv._4_4_ = Ncv._4_4_ + 1) {
        Scv = ON_NurbsCurve::CV(crv,Ncv._4_4_);
        for (Ncv._0_4_ = 0; (int)Ncv < iVar2; Ncv._0_4_ = (int)Ncv + 1) {
          pdVar5 = CV(srf,(int)Ncv,Ncv._4_4_);
          memcpy(Scv,pdVar5,(long)iVar1 << 3);
          Scv = Scv + iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_NurbsSurface::ON_Internal_ConvertToCurve(const ON_NurbsSurface& srf,
                                                 int dir, ON_NurbsCurve& crv) {
  crv.DestroyCurveTree();
  if (dir)
    dir = 1;
  const int Sdim = srf.CVSize();
  const int n = srf.CVCount(1-dir);
  const int Ndim = Sdim*n;
  const int knot_count = srf.KnotCount(dir);
  int i, j;
  double *Ncv;
  const double *Scv;

  crv.m_dim = Ndim;
  crv.m_is_rat = 0;
  crv.m_order = srf.Order(dir);
  crv.m_cv_count = srf.CVCount(dir);
  crv.m_cv_stride = crv.m_dim;
  crv.ReserveCVCapacity(srf.CVCount(dir)*Ndim);
  crv.ReserveKnotCapacity(srf.KnotCount(dir));

  if ( crv.m_knot != srf.m_knot[dir] && srf.m_knot[dir] ) 
  {
    memcpy( crv.m_knot, srf.m_knot[dir], knot_count*sizeof(crv.m_knot[0]) );
  }

  if ( crv.m_cv != srf.m_cv && srf.m_cv ) 
  {
    if (dir) {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(j,i);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
    else {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(i,j);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
  }
}